

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

BOOL MiscPutenv(char *string,BOOL deleteIfEmpty)

{
  int iVar1;
  int iVar2;
  CPalThread *pThread;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  char **ppcVar7;
  size_t szSize;
  BOOL BVar8;
  int iVar9;
  char **local_40;
  char *local_38;
  
  pThread = CorUnix::InternalGetCurrentThread();
  pcVar3 = strchr(string,0x3d);
  if (pcVar3 == (char *)0x0 || pcVar3 == string) {
    return 0;
  }
  if ((deleteIfEmpty != 0) && (pcVar3[1] == '\0')) {
    sVar4 = strlen(string);
    local_38 = (char *)CorUnix::InternalMalloc((long)(int)sVar4);
    if (local_38 == (char *)0x0) {
      return 0;
    }
    sVar4 = (long)((sVar4 << 0x20) + -0x100000000) >> 0x20;
    memcpy(local_38,string,sVar4);
    local_38[sVar4] = '\0';
    MiscUnsetenv(local_38);
    BVar8 = 1;
    goto LAB_0011628d;
  }
  local_38 = CorUnix::InternalStrdup(string);
  if (local_38 == (char *)0x0) {
    return 0;
  }
  CorUnix::InternalEnterCriticalSection(pThread,&gcsEnvironment);
  ppcVar7 = palEnvironment;
  local_40 = palEnvironment;
  sVar4 = (size_t)((int)pcVar3 - (int)string);
  iVar9 = 1;
  while( true ) {
    iVar1 = iVar9 + -1;
    pcVar3 = ppcVar7[iVar1];
    if (pcVar3 == (char *)0x0) break;
    pcVar5 = strchr(pcVar3,0x3d);
    if (pcVar5 == (char *)0x0) {
      sVar6 = strlen(pcVar3);
      pcVar5 = pcVar3 + sVar6;
    }
    if (((long)pcVar5 - (long)pcVar3 == sVar4) && (iVar2 = memcmp(string,pcVar3,sVar4), iVar2 == 0))
    {
      ppcVar7[iVar1] = local_38;
      local_40 = palEnvironment;
      BVar8 = 1;
      local_38 = (char *)0x0;
      if (palEnvironment[iVar1] != (char *)0x0) goto LAB_00116274;
      goto LAB_001161c5;
    }
    iVar9 = iVar9 + 1;
  }
  BVar8 = 0;
LAB_001161c5:
  szSize = (long)(iVar9 + 1) << 3;
  if (MiscPutenv::sAllocatedEnviron == '\x01') {
    ppcVar7 = (char **)CorUnix::InternalRealloc(local_40,szSize);
    if (ppcVar7 != (char **)0x0) {
LAB_00116248:
      palEnvironment = ppcVar7;
      _environ = ppcVar7;
      ppcVar7[iVar1] = local_38;
      palEnvironment[iVar9] = (char *)0x0;
      BVar8 = 1;
      local_38 = (char *)0x0;
    }
  }
  else {
    ppcVar7 = (char **)CorUnix::InternalMalloc(szSize);
    if (ppcVar7 != (char **)0x0) {
      iVar2 = 0;
      while( true ) {
        if (palEnvironment[iVar2] == (char *)0x0) break;
        ppcVar7[iVar2] = palEnvironment[iVar2];
        iVar2 = iVar2 + 1;
      }
      MiscPutenv::sAllocatedEnviron = '\x01';
      goto LAB_00116248;
    }
  }
LAB_00116274:
  CorUnix::InternalLeaveCriticalSection(pThread,&gcsEnvironment);
  if (local_38 == (char *)0x0) {
    return BVar8;
  }
LAB_0011628d:
  CorUnix::InternalFree(local_38);
  return BVar8;
}

Assistant:

BOOL MiscPutenv(const char *string, BOOL deleteIfEmpty)
{
    const char *equals, *existingEquals;
    char *copy = NULL;
    int length;
    int i, j;
    bool fOwningCS = false;
    BOOL result = FALSE;
    CPalThread * pthrCurrent = InternalGetCurrentThread();

    equals = strchr(string, '=');
    if (equals == string || equals == NULL)
    {
        // "=foo" and "foo" have no meaning
        goto done;
    }
    if (equals[1] == '\0' && deleteIfEmpty)
    {
        // "foo=" removes foo from the environment in _putenv() on Windows.
        // The same string can result from a call to SetEnvironmentVariable()
        // with the empty string as the value, but in that case we want to
        // set the variable's value to "". deleteIfEmpty will be FALSE in
        // that case.
        length = strlen(string);
        copy = (char *) InternalMalloc(length);
        if (copy == NULL)
        {
            goto done;
        }
        memcpy(copy, string, length - 1);
        copy[length - 1] = '\0';    // Change '=' to '\0'
        MiscUnsetenv(copy);
        result = TRUE;
    }
    else
    {
        // See if we are replacing an item or adding one.

        // Make our copy up front, since we'll use it either way.
        copy = InternalStrdup(string);
        if (copy == NULL)
        {
            goto done;
        }

        length = equals - string;

        InternalEnterCriticalSection(pthrCurrent, &gcsEnvironment);
        fOwningCS = true;

        for(i = 0; palEnvironment[i] != NULL; i++)
        {
            existingEquals = strchr(palEnvironment[i], '=');
            if (existingEquals == NULL)
            {
                // The PAL screens out malformed strings, but
                // environ comes from the system, so it might
                // have strings without '='. We treat the entire
                // string as a name in that case.
                existingEquals = palEnvironment[i] + strlen(palEnvironment[i]);
            }
            if (existingEquals - palEnvironment[i] == length)
            {
                if (memcmp(string, palEnvironment[i], length) == 0)
                {
                    // Replace this one. Don't free the original,
                    // though, because there may be outstanding
                    // references to it that were acquired via
                    // getenv. This is an unavoidable memory leak.
                    palEnvironment[i] = copy;

                    // Set 'copy' to NULL so it won't be freed
                    copy = NULL;

                    result = TRUE;
                    break;
                }
            }
        }
        if (palEnvironment[i] == NULL)
        {
            static BOOL sAllocatedEnviron = FALSE;
            // Add a new environment variable.
            // We'd like to realloc palEnvironment, but we can't do that the
            // first time through.
            char **newEnviron = NULL;

            if (sAllocatedEnviron) {
                if (NULL == (newEnviron =
                        (char **)InternalRealloc(palEnvironment, (i + 2) * sizeof(char *))))
                {
                    goto done;
                }
            }
            else
            {
                // Allocate palEnvironment ourselves so we can realloc it later.
                newEnviron = (char **)InternalMalloc((i + 2) * sizeof(char *));
                if (newEnviron == NULL)
                {
                    goto done;
                }
                for(j = 0; palEnvironment[j] != NULL; j++)
                {
                    newEnviron[j] = palEnvironment[j];
                }
                sAllocatedEnviron = TRUE;
            }
            palEnvironment = newEnviron;
            MiscSetEnvArray();
            palEnvironment[i] = copy;
            palEnvironment[i + 1] = NULL;

            // Set 'copy' to NULL so it won't be freed
            copy = NULL;

            result = TRUE;
        }
    }
done:

    if (fOwningCS)
    {
        InternalLeaveCriticalSection(pthrCurrent, &gcsEnvironment);
    }
    if (NULL != copy)
    {
        InternalFree(copy);
    }
    return result;
}